

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_controller.cpp
# Opt level: O3

duration __thiscall
so_5::stats::impl::std_controller_t::set_distribution_period(std_controller_t *this,duration period)

{
  rep rVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_data_lock);
  if (iVar2 == 0) {
    rVar1 = (this->m_distribution_period).__r;
    (this->m_distribution_period).__r = period.__r;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_data_lock);
    return (duration)rVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

std::chrono::steady_clock::duration
std_controller_t::set_distribution_period(
	std::chrono::steady_clock::duration period )
	{
		std::lock_guard< std::mutex > lock{ m_data_lock };
		
		auto ret_value = m_distribution_period;

		m_distribution_period = period;

		return ret_value;
	}